

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TiledOutputFile::TiledOutputFile(TiledOutputFile *this,OutputPartData *part)

{
  bool bVar1;
  string *__lhs;
  Data *pDVar2;
  ArgExc *this_00;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__TiledOutputFile_001e4470;
  this->_deleteStream = false;
  __lhs = Header::type_abi_cxx11_(&part->header);
  bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )TILEDIMAGE_abi_cxx11_);
  if (!bVar1) {
    this->_streamData = part->mutex;
    pDVar2 = (Data *)operator_new(0x178);
    Data::Data(pDVar2,part->numThreads);
    this->_data = pDVar2;
    pDVar2->multipart = part->multipart;
    initialize(this,&part->header);
    pDVar2 = this->_data;
    pDVar2->partNumber = part->partNumber;
    pDVar2->tileOffsetsPosition = part->chunkOffsetTablePosition;
    pDVar2->previewPosition = part->previewPosition;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Can\'t build a TiledOutputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

TiledOutputFile::TiledOutputFile (const OutputPartData* part)
    : _deleteStream (false)
{
    try
    {
        if (part->header.type () != TILEDIMAGE)
            throw IEX_NAMESPACE::ArgExc (
                "Can't build a TiledOutputFile from a type-mismatched part.");

        _streamData      = part->mutex;
        _data            = new Data (part->numThreads);
        _data->multipart = part->multipart;
        initialize (part->header);
        _data->partNumber          = part->partNumber;
        _data->tileOffsetsPosition = part->chunkOffsetTablePosition;
        _data->previewPosition     = part->previewPosition;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot initialize output part "
            "\"" << part->partNumber
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}